

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-fds.c
# Opt level: O2

int sanity_assert_no_sockfd_traces(lws_context *context,lws_sockfd_type sfd)

{
  lws **pplVar1;
  uint __line;
  long lVar2;
  
  if ((sfd != -1) && (pplVar1 = context->lws_lookup, pplVar1 != (lws **)0x0)) {
    if (((context->field_0x7b8 & 4) == 0) && (pplVar1[sfd] != (lws *)0x0)) {
      __line = 0x62;
LAB_00130787:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/plat/unix/unix-fds.c"
                    ,__line,
                    "int sanity_assert_no_sockfd_traces(const struct lws_context *, lws_sockfd_type)"
                   );
    }
    for (lVar2 = 0; (ulong)context->max_fds << 3 != lVar2; lVar2 = lVar2 + 8) {
      if ((*(long *)((long)pplVar1 + lVar2) != 0) &&
         (*(int *)(*(long *)((long)pplVar1 + lVar2) + 0x450) == sfd)) {
        __line = 0x73;
        goto LAB_00130787;
      }
    }
  }
  return 0;
}

Assistant:

int
sanity_assert_no_sockfd_traces(const struct lws_context *context,
			       lws_sockfd_type sfd)
{
#if LWS_MAX_SMP > 1
	/*
	 * We can't really do this test... another thread can accept and
	 * reuse the closed fd
	 */
	return 0;
#else
	struct lws **p, **done;

	if (sfd == LWS_SOCK_INVALID || !context->lws_lookup)
		return 0;

	if (!context->max_fds_unrelated_to_ulimit &&
	    context->lws_lookup[sfd - lws_plat_socket_offset()]) {
		assert(0); /* the fd is still in use */
		return 1;
	}

	/* slow fds handling */

	p = context->lws_lookup;
	done = &p[context->max_fds];

	/* confirm the sfd not already in use */

	while (p != done && (!*p || (*p)->desc.sockfd != sfd))
		p++;

	if (p == done)
		return 0;

	assert(0); /* this fd is still in the tables */

	return 1;
#endif
}